

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<float,_true,_std::allocator<unsigned_long>_>::testInvariant
          (View<float,_true,_std::allocator<unsigned_long>_> *this)

{
  bool bVar1;
  size_t sVar2;
  CoordinateOrder *pCVar3;
  size_t sVar4;
  ulong local_48;
  size_t j_3;
  size_t j_2;
  size_t tmp_1;
  size_t j_1;
  size_t tmp;
  size_t j;
  size_t testSize;
  View<float,_true,_std::allocator<unsigned_long>_> *this_local;
  
  sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                    ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  if (sVar2 == 0) {
    bVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    marray_detail::Assert<bool>(bVar1);
    if (*(long *)this != 0) {
      sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      marray_detail::Assert<bool>(sVar2 == 1);
    }
  }
  else {
    marray_detail::Assert<bool>(*(long *)this != 0);
    j = 1;
    for (tmp = 0; sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                                    ((Geometry<std::allocator<unsigned_long>_> *)(this + 8)),
        tmp < sVar2; tmp = tmp + 1) {
      sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),tmp);
      j = sVar2 * j;
    }
    sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    marray_detail::Assert<bool>(sVar2 == j);
    pCVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    if (*pCVar3 == FirstMajorOrder) {
      j_1 = 1;
      for (tmp_1 = 0;
          sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8)), tmp_1 < sVar2;
          tmp_1 = tmp_1 + 1) {
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),
                           (sVar2 - tmp_1) - 1);
        marray_detail::Assert<bool>(sVar2 == j_1);
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),
                           (sVar2 - tmp_1) - 1);
        j_1 = sVar2 * j_1;
      }
    }
    else {
      j_2 = 1;
      for (j_3 = 0; sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8)),
          j_3 < sVar2; j_3 = j_3 + 1) {
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),j_3);
        marray_detail::Assert<bool>(sVar2 == j_2);
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),j_3);
        j_2 = sVar2 * j_2;
      }
    }
    bVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    if (bVar1) {
      for (local_48 = 0;
          sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8)),
          local_48 < sVar2; local_48 = local_48 + 1) {
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_48);
        sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_48);
        marray_detail::Assert<bool>(sVar2 == sVar4);
      }
    }
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::testInvariant() const
{
    if(!MARRAY_NO_DEBUG) {
        if(geometry_.dimension() == 0) {
            marray_detail::Assert(geometry_.isSimple() == true);
            if(data_ != 0) { // scalar
                marray_detail::Assert(geometry_.size() == 1);
            }
        }
        else {
            marray_detail::Assert(data_ != 0);

            // test size_ to be consistent with shape_
            std::size_t testSize = 1;
            for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                testSize *= geometry_.shape(j);
            }
            marray_detail::Assert(geometry_.size() == testSize);

            // test shapeStrides_ to be consistent with shape_
            if(geometry_.coordinateOrder() == FirstMajorOrder) {
                std::size_t tmp = 1;
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.shapeStrides(geometry_.dimension()-j-1) == tmp);
                    tmp *= geometry_.shape(geometry_.dimension()-j-1);
                }
            }
            else {
                std::size_t tmp = 1;
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.shapeStrides(j) == tmp);
                    tmp *= geometry_.shape(j);
                }
            }

            // test the simplicity condition 
            if(geometry_.isSimple()) {
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.strides(j) == geometry_.shapeStrides(j));
                }
            }
        }
    }
}